

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void __thiscall BaseIndex::Sync(BaseIndex *this)

{
  string *args;
  long lVar1;
  bool bVar2;
  int iVar3;
  CBlockIndex *index;
  long lVar4;
  long lVar5;
  __pointer_type block_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  long local_130;
  BlockInfo block_info;
  base_blob<256u> local_e8 [32];
  string local_c8;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  block_00 = (this->m_best_block_index)._M_b._M_p;
  if (((this->m_synced)._M_base._M_i & 1U) == 0) {
    args = &this->m_name;
    lVar5 = 0;
    local_130 = 0;
    do {
      bVar2 = CThreadInterrupt::operator_cast_to_bool(&this->m_interrupt);
      if (bVar2) {
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
        ;
        source_file_02._M_len = 0x5e;
        logging_function_02._M_str = "Sync";
        logging_function_02._M_len = 4;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_02,source_file_02,0x98,ALL,Info,
                   (ConstevalFormatString<1U>)0xc8ef75,args);
        SetBestBlockIndex(this,block_00);
        Commit(this);
        goto LAB_006d8ebb;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&block,&cs_main,"cs_main",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                 ,0xa2,false);
      index = NextSyncBlock(block_00,&this->m_chainstate->m_chain);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&block);
      if (index == (CBlockIndex *)0x0) {
        SetBestBlockIndex(this,block_00);
        Commit(this);
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&block,&cs_main,"::cs_main",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                   ,0xaf,false);
        index = NextSyncBlock(block_00,&this->m_chainstate->m_chain);
        iVar3 = 0;
        if (index == (CBlockIndex *)0x0) {
          LOCK();
          (this->m_synced)._M_base._M_i = true;
          UNLOCK();
          iVar3 = 3;
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&block);
        if (index != (CBlockIndex *)0x0) goto LAB_006d8c9c;
      }
      else {
LAB_006d8c9c:
        if ((index->pprev != block_00) && (bVar2 = Rewind(this,block_00,index->pprev), !bVar2)) {
          FatalErrorf<char[5],std::__cxx11::string>
                    (this,(ConstevalFormatString<2U>)0xc8ef9e,(char (*) [5])0xc964b4,args);
          goto LAB_006d8ebb;
        }
        CBlock::CBlock(&block);
        kernel::MakeBlockInfo(&block_info,index,(CBlock *)0x0);
        bVar2 = ::node::BlockManager::ReadBlockFromDisk(this->m_chainstate->m_blockman,&block,index)
        ;
        if (bVar2) {
          block_info.data = &block;
          iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xc])
                            (this,&block_info);
          if ((char)iVar3 == '\0') {
            CBlockIndex::GetBlockHash((uint256 *)local_e8,index);
            base_blob<256u>::ToString_abi_cxx11_(&local_c8,local_e8);
            FatalErrorf<char[5],std::__cxx11::string>
                      (this,(ConstevalFormatString<2U>)0xc8effa,(char (*) [5])0xc964b4,&local_c8);
            goto LAB_006d8e06;
          }
          lVar4 = std::chrono::_V2::steady_clock::now();
          if (local_130 + 30000000000 < lVar4) {
            source_file._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
            ;
            source_file._M_len = 0x5e;
            logging_function._M_str = "Sync";
            logging_function._M_len = 4;
            LogPrintFormatInternal<std::__cxx11::string,int>
                      (logging_function,source_file,0xcf,ALL,Info,
                       (ConstevalFormatString<2U>)0xc8f029,args,&index->nHeight);
            local_130 = lVar4;
          }
          iVar3 = 0;
          if (lVar5 + 30000000000 < lVar4) {
            SetBestBlockIndex(this,index);
            Commit(this);
            lVar5 = lVar4;
          }
        }
        else {
          CBlockIndex::GetBlockHash((uint256 *)local_e8,index);
          base_blob<256u>::ToString_abi_cxx11_(&local_c8,local_e8);
          FatalErrorf<char[5],std::__cxx11::string>
                    (this,(ConstevalFormatString<2U>)0xc8efd4,(char (*) [5])0xc964b4,&local_c8);
LAB_006d8e06:
          std::__cxx11::string::~string((string *)&local_c8);
          iVar3 = 1;
        }
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector(&block.vtx);
        block_00 = index;
      }
    } while (iVar3 == 0);
    if (iVar3 != 3) goto LAB_006d8ebb;
  }
  if (block_00 == (__pointer_type)0x0) {
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
    ;
    source_file_01._M_len = 0x5e;
    logging_function_01._M_str = "Sync";
    logging_function_01._M_len = 4;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_01,source_file_01,0xdf,ALL,Info,(ConstevalFormatString<1U>)0xc8f071,
               &this->m_name);
  }
  else {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "Sync";
    logging_function_00._M_len = 4;
    LogPrintFormatInternal<std::__cxx11::string,int>
              (logging_function_00,source_file_00,0xdd,ALL,Info,(ConstevalFormatString<2U>)0xc8f055,
               &this->m_name,&block_00->nHeight);
  }
LAB_006d8ebb:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BaseIndex::Sync()
{
    const CBlockIndex* pindex = m_best_block_index.load();
    if (!m_synced) {
        std::chrono::steady_clock::time_point last_log_time{0s};
        std::chrono::steady_clock::time_point last_locator_write_time{0s};
        while (true) {
            if (m_interrupt) {
                LogPrintf("%s: m_interrupt set; exiting ThreadSync\n", GetName());

                SetBestBlockIndex(pindex);
                // No need to handle errors in Commit. If it fails, the error will be already be
                // logged. The best way to recover is to continue, as index cannot be corrupted by
                // a missed commit to disk for an advanced index state.
                Commit();
                return;
            }

            const CBlockIndex* pindex_next = WITH_LOCK(cs_main, return NextSyncBlock(pindex, m_chainstate->m_chain));
            // If pindex_next is null, it means pindex is the chain tip, so
            // commit data indexed so far.
            if (!pindex_next) {
                SetBestBlockIndex(pindex);
                // No need to handle errors in Commit. See rationale above.
                Commit();

                // If pindex is still the chain tip after committing, exit the
                // sync loop. It is important for cs_main to be locked while
                // setting m_synced = true, otherwise a new block could be
                // attached while m_synced is still false, and it would not be
                // indexed.
                LOCK(::cs_main);
                pindex_next = NextSyncBlock(pindex, m_chainstate->m_chain);
                if (!pindex_next) {
                    m_synced = true;
                    break;
                }
            }
            if (pindex_next->pprev != pindex && !Rewind(pindex, pindex_next->pprev)) {
                FatalErrorf("%s: Failed to rewind index %s to a previous chain tip", __func__, GetName());
                return;
            }
            pindex = pindex_next;


            CBlock block;
            interfaces::BlockInfo block_info = kernel::MakeBlockInfo(pindex);
            if (!m_chainstate->m_blockman.ReadBlockFromDisk(block, *pindex)) {
                FatalErrorf("%s: Failed to read block %s from disk",
                           __func__, pindex->GetBlockHash().ToString());
                return;
            } else {
                block_info.data = &block;
            }
            if (!CustomAppend(block_info)) {
                FatalErrorf("%s: Failed to write block %s to index database",
                           __func__, pindex->GetBlockHash().ToString());
                return;
            }

            auto current_time{std::chrono::steady_clock::now()};
            if (last_log_time + SYNC_LOG_INTERVAL < current_time) {
                LogPrintf("Syncing %s with block chain from height %d\n",
                          GetName(), pindex->nHeight);
                last_log_time = current_time;
            }

            if (last_locator_write_time + SYNC_LOCATOR_WRITE_INTERVAL < current_time) {
                SetBestBlockIndex(pindex);
                last_locator_write_time = current_time;
                // No need to handle errors in Commit. See rationale above.
                Commit();
            }
        }
    }

    if (pindex) {
        LogPrintf("%s is enabled at height %d\n", GetName(), pindex->nHeight);
    } else {
        LogPrintf("%s is enabled\n", GetName());
    }
}